

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter_find.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::algorithm::
  iter_split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *Result,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
            token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *Finder)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Tmp;
  transform_iter_type itEnd;
  transform_iter_type itBegin;
  input_iterator_type InputEnd;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lit_input;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_261;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_fffffffffffffdb8;
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdc8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd0;
  allocator_type *in_stack_fffffffffffffe38;
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  *in_stack_fffffffffffffe40;
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  *in_stack_fffffffffffffe48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  undefined1 local_1a0 [72];
  undefined1 local_158 [128];
  char *local_d8;
  char *local_d0;
  undefined1 local_c8 [72];
  undefined1 local_80 [80];
  char *local_30;
  iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8._M_current = (char *)in_RDI;
  local_28 = (iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              )as_literal<std::__cxx11::string>(in_stack_fffffffffffffd70);
  this = (split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_28;
  local_30 = (char *)range_adl_barrier::
                     end<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                               ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffd68);
  local_d0 = (char *)range_adl_barrier::
                     begin<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                               ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffd68);
  local_d8 = local_30;
  detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)in_stack_fffffffffffffd70
             ,in_stack_fffffffffffffd68);
  split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
  split_iterator<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdb8);
  iterators::
  make_transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            (local_80,local_c8);
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~split_iterator((split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x19468c);
  detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::~token_finderF
            ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)0x194699);
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::split_iterator(this);
  iterators::
  make_transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            (local_158,local_1a0);
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~split_iterator((split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x1946cc);
  iterators::
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  ::transform_iterator
            ((transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)in_stack_fffffffffffffd70,
             (transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)in_stack_fffffffffffffd68);
  iterators::
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  ::transform_iterator
            ((transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)in_stack_fffffffffffffd70,
             (transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)in_stack_fffffffffffffd68);
  __x = &local_261;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x194706);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<boost::iterators::transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterators::use_default,boost::iterators::use_default>,void>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x194731);
  iterators::
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  ::~transform_iterator
            ((transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)0x19473b);
  iterators::
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  ::~transform_iterator
            ((transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)0x194748);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  iterators::
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  ::~transform_iterator
            ((transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)0x194784);
  iterators::
  transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
  ::~transform_iterator
            ((transform_iterator<boost::algorithm::detail::copy_iterator_rangeF<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::iterators::use_default,_boost::iterators::use_default>
              *)0x194791);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_8._M_current;
}

Assistant:

inline SequenceSequenceT&
        iter_split(
            SequenceSequenceT& Result,
            RangeT& Input,
            FinderT Finder )
        {
            BOOST_CONCEPT_ASSERT((
                FinderConcept<FinderT,
                BOOST_STRING_TYPENAME range_iterator<RangeT>::type>
                ));

            iterator_range<BOOST_STRING_TYPENAME range_iterator<RangeT>::type> lit_input(::boost::as_literal(Input));

            typedef BOOST_STRING_TYPENAME 
                range_iterator<RangeT>::type input_iterator_type;
            typedef split_iterator<input_iterator_type> find_iterator_type;
            typedef detail::copy_iterator_rangeF<
                BOOST_STRING_TYPENAME 
                    range_value<SequenceSequenceT>::type,
                input_iterator_type> copy_range_type;
            
            input_iterator_type InputEnd=::boost::end(lit_input);

            typedef transform_iterator<copy_range_type, find_iterator_type>
                transform_iter_type;
    
            transform_iter_type itBegin=
                ::boost::make_transform_iterator( 
                    find_iterator_type( ::boost::begin(lit_input), InputEnd, Finder ),
                    copy_range_type() );

            transform_iter_type itEnd=
                ::boost::make_transform_iterator( 
                    find_iterator_type(),
                    copy_range_type() );
            
            SequenceSequenceT Tmp(itBegin, itEnd);

            Result.swap(Tmp);
            return Result;
        }